

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

void Bus_SclInsertFanout(Vec_Ptr_t *vFanouts,Abc_Obj_t *pObj)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  void **ppvVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  Abc_Obj_t *pCur;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  uVar1 = vFanouts->nSize;
  local_40 = pObj;
  if ((long)(int)uVar1 < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pvVar2 = vFanouts->pArray[lVar6];
      if (pvVar2 != (void *)0x0) {
        if (uVar1 <= uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar7 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        vFanouts->pArray[uVar7] = pvVar2;
      }
      lVar6 = lVar6 + 1;
    } while ((int)uVar1 != lVar6);
  }
  if ((int)uVar1 < (int)uVar5) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  vFanouts->nSize = uVar5;
  uVar1 = vFanouts->nCap;
  if (uVar5 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vFanouts->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vFanouts->pArray,0x80);
      }
      vFanouts->pArray = ppvVar4;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_00456d7f;
      if (vFanouts->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vFanouts->pArray,(ulong)uVar1 << 4);
      }
      vFanouts->pArray = ppvVar4;
    }
    vFanouts->nCap = iVar3;
  }
LAB_00456d7f:
  uVar1 = vFanouts->nSize;
  lVar6 = (long)(int)uVar1;
  vFanouts->nSize = uVar1 + 1;
  vFanouts->pArray[lVar6] = pObj;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      uVar5 = uVar1 - 1;
      if (vFanouts->nSize <= (int)uVar5) {
LAB_00456e19:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_38 = (Abc_Obj_t *)vFanouts->pArray[uVar5];
      if (vFanouts->nSize < (int)(uVar1 + 1)) goto LAB_00456e19;
      local_40 = (Abc_Obj_t *)vFanouts->pArray[lVar6 + -1];
      iVar3 = Bus_SclCompareFanouts(&local_38,&local_40);
      if (iVar3 == -1) {
        return;
      }
      ppvVar4 = vFanouts->pArray;
      pvVar2 = ppvVar4[uVar5];
      ppvVar4[uVar5] = ppvVar4[lVar6 + -1];
      vFanouts->pArray[lVar6 + -1] = pvVar2;
      lVar6 = lVar6 + -1;
      uVar1 = uVar5;
    } while (1 < lVar6);
  }
  return;
}

Assistant:

void Bus_SclInsertFanout( Vec_Ptr_t * vFanouts, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pCur;
    int i, k;
    // compact array
    for ( i = k = 0; i < Vec_PtrSize(vFanouts); i++ )
        if ( Vec_PtrEntry(vFanouts, i) != NULL )
            Vec_PtrWriteEntry( vFanouts, k++, Vec_PtrEntry(vFanouts, i) );
    Vec_PtrShrink( vFanouts, k );
    // insert new entry
    Vec_PtrPush( vFanouts, pObj );
    for ( i = Vec_PtrSize(vFanouts) - 1; i > 0; i-- )
    {
        pCur = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i-1);
        pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i);
        if ( Bus_SclCompareFanouts( &pCur, &pObj ) == -1 )
            break;
        ABC_SWAP( void *, Vec_PtrArray(vFanouts)[i-1], Vec_PtrArray(vFanouts)[i] );
    }
}